

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_path_common.cpp
# Opt level: O0

client_pipe __thiscall pstore::brokerface::fifo_path::open_client_pipe(fifo_path *this)

{
  bool bVar1;
  ostream *__os;
  fifo_path *in_RSI;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8 [32];
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_1d8;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_1c8;
  ostringstream local_1b8 [8];
  ostringstream str;
  undefined1 local_34 [28];
  uint tries;
  fifo_path *this_local;
  client_pipe *fd;
  
  local_34[0x1b] = '\0';
  this_local = this;
  details::descriptor<pstore::details::posix_descriptor_traits>::descriptor();
  local_34._20_4_ = 0;
  while( true ) {
    bVar1 = true;
    if (in_RSI->max_retries_ != 0xffffffff) {
      bVar1 = (uint)local_34._20_4_ <= in_RSI->max_retries_;
    }
    if (!bVar1) break;
    std::function<void_(pstore::brokerface::fifo_path::operation)>::operator()
              (&in_RSI->update_cb_,open);
    open_impl((fifo_path *)local_34);
    details::descriptor<pstore::details::posix_descriptor_traits>::operator=
              ((descriptor<pstore::details::posix_descriptor_traits> *)this,
               (descriptor<pstore::details::posix_descriptor_traits> *)local_34);
    details::descriptor<pstore::details::posix_descriptor_traits>::~descriptor
              ((descriptor<pstore::details::posix_descriptor_traits> *)local_34);
    bVar1 = details::descriptor<pstore::details::posix_descriptor_traits>::valid
                      ((descriptor<pstore::details::posix_descriptor_traits> *)this);
    if (bVar1) break;
    std::function<void_(pstore::brokerface::fifo_path::operation)>::operator()
              (&in_RSI->update_cb_,wait);
    wait_until_impl(in_RSI,(milliseconds)(in_RSI->retry_timeout_).__r);
    local_34._20_4_ = local_34._20_4_ + 1;
  }
  bVar1 = details::descriptor<pstore::details::posix_descriptor_traits>::valid
                    ((descriptor<pstore::details::posix_descriptor_traits> *)this);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    __os = std::operator<<((ostream *)local_1b8,"Could not open client named pipe ");
    _Var2 = quoted(&in_RSI->path_);
    local_1c8._M_string = _Var2._M_string;
    local_1d8._8_2_ = _Var2._8_2_;
    local_1c8._M_delim = local_1d8._M_delim;
    local_1c8._M_escape = local_1d8._M_escape;
    local_1d8 = _Var2;
    std::__detail::operator<<(__os,&local_1c8);
    std::__cxx11::ostringstream::str();
    raise<pstore::error_code,std::__cxx11::string>(unable_to_open_named_pipe,local_1f8);
  }
  return (client_pipe)this;
}

Assistant:

auto fifo_path::open_client_pipe () const -> client_pipe {
            client_pipe fd{};
            auto tries = 0U;
            for (; max_retries_ == infinite_retries || tries <= max_retries_; ++tries) {
                update_cb_ (operation::open);
                fd = this->open_impl ();
                if (fd.valid ()) {
                    break;
                }
                update_cb_ (operation::wait);
                this->wait_until_impl (retry_timeout_);
            }

            if (!fd.valid ()) {
                std::ostringstream str;
                str << "Could not open client named pipe " << pstore::quoted (path_);
                raise (error_code::unable_to_open_named_pipe, str.str ());
            }
            return fd;
        }